

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmJmp<(moira::Instr)63,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  Ea<(moira::Mode)8,_4> src;
  undefined1 local_2c [20];
  
  Op<(moira::Mode)8,4>((Ea<(moira::Mode)8,_4> *)local_2c,this,op & 7,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)8,_4> *)local_2c);
  return;
}

Assistant:

void
Moira::dasmJmp(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src;
}